

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rational.hpp
# Opt level: O1

void __thiscall
scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::Rational
          (Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *this,double x)

{
  BigInt<unsigned_int,_unsigned_long> *pBVar1;
  uint64_t x_00;
  uint uVar2;
  BigInt<unsigned_int,_unsigned_long> *this_00;
  BigInt<unsigned_int,_unsigned_long> local_50;
  
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::Frac
            (&this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>);
  (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._vptr_Frac =
       (_func_int **)&PTR__Frac_0010fbc8;
  BigInt<unsigned_int,_unsigned_long>::BigInt(&local_50,0x10000000000000);
  pBVar1 = &(this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&pBVar1->_values,&local_50);
  (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q._positive = local_50._positive;
  if (local_50._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  BigInt<unsigned_int,_unsigned_long>::BigInt
            (&local_50,((ulong)x & 0xfffffffffffff) + 0x10000000000000);
  uVar2 = (uint)((ulong)x >> 0x34) & 0x7ff;
  this_00 = &(this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this_00->_values,&local_50);
  (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p._positive = local_50._positive;
  if (local_50._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (uVar2 < 0x3ff) {
    x_00 = 0x3ff - (ulong)uVar2;
    this_00 = pBVar1;
  }
  else {
    if (uVar2 == 0x3ff) goto LAB_00103fec;
    x_00 = (ulong)uVar2 - 0x3ff;
  }
  BigInt<unsigned_int,_unsigned_long>::operator<<=(this_00,x_00);
LAB_00103fec:
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::_simplify
            (&this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>);
  return;
}

Assistant:

constexpr Rational<TInteger>::Rational(double x) : Frac<TInteger>()
	{
		const uint64_t raw = *reinterpret_cast<uint64_t*>(&x);

		constexpr uint64_t signFilter = 0x8000000000000000;
		constexpr uint64_t exponentFilter = 0x7FF0000000000000;
		constexpr uint8_t exponentShift = 52;
		constexpr uint64_t mantissaFilter = 0x000FFFFFFFFFFFFF;
		constexpr uint64_t mantissaDivisor = 0x0010000000000000;

		bool negative = (raw & signFilter) != 0;
		uint64_t exponent = (raw & exponentFilter) >> exponentShift;
		uint64_t mantissa = (raw & mantissaFilter);

		_q = mantissaDivisor;
		_p = mantissaDivisor + mantissa;

		if (exponent < 1023)
		{
			_q <<= 1023 - exponent;
		}
		else if (exponent > 1023)
		{
			_p <<= exponent - 1023;
		}

		_simplify();
	}